

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
ncnn::ParamDict::get(string *__return_storage_ptr__,ParamDict *this,int id,string *def)

{
  anon_struct_112_4_78a8b69f *paVar1;
  string *psVar2;
  
  paVar1 = this->d->params + id;
  psVar2 = &paVar1->s;
  if (paVar1->type == 0) {
    psVar2 = def;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamDict::get(int id, const std::string& def) const
{
    return d->params[id].type ? d->params[id].s : def;
}